

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

void __thiscall State::AddPool(State *this,Pool *pool)

{
  string *psVar1;
  Pool *pPVar2;
  mapped_type *ppPVar3;
  Pool *pool_local;
  State *this_local;
  
  psVar1 = Pool::name_abi_cxx11_(pool);
  pPVar2 = LookupPool(this,psVar1);
  if (pPVar2 == (Pool *)0x0) {
    psVar1 = Pool::name_abi_cxx11_(pool);
    ppPVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
              ::operator[](&this->pools_,psVar1);
    *ppPVar3 = pool;
    return;
  }
  __assert_fail("LookupPool(pool->name()) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/state.cc"
                ,0x54,"void State::AddPool(Pool *)");
}

Assistant:

void State::AddPool(Pool* pool) {
  assert(LookupPool(pool->name()) == NULL);
  pools_[pool->name()] = pool;
}